

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<4,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::ObjectIntersectorK<4,_false>_>,_false>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar1;
  undefined4 uVar2;
  uint uVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  NodeRef nodeRef;
  ulong uVar7;
  RTCIntersectFunctionN p_Var8;
  NodeRef *pNVar9;
  size_t sVar10;
  uint i;
  long lVar11;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar12;
  size_t sVar13;
  ulong uVar14;
  bool bVar15;
  vint4 ai_2;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [64];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 ai;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar32 [64];
  vint4 ai_1;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  vint4 ai_3;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  vint4 bi;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  vint4 bi_1;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 bi_3;
  undefined1 auVar41 [16];
  vint4 bi_2;
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  vint4 bi_8;
  undefined1 local_17e8 [16];
  RTCIntersectFunctionNArguments local_17c0;
  Geometry *local_1790;
  undefined8 local_1788;
  RTCIntersectArguments *local_1780;
  float local_1778;
  float fStack_1774;
  float fStack_1770;
  float fStack_176c;
  float local_1768;
  float fStack_1764;
  float fStack_1760;
  float fStack_175c;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 local_1758;
  undefined1 local_1748 [16];
  undefined1 local_1738 [16];
  undefined1 local_1728 [16];
  undefined8 local_1718;
  undefined8 uStack_1710;
  undefined1 local_1708 [16];
  float local_16f8;
  float fStack_16f4;
  float fStack_16f0;
  float fStack_16ec;
  vint<4> mask;
  NodeRef stack_node [241];
  vfloat<4> stack_near [241];
  
  sVar13 = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (sVar13 != 8) {
    if ((context->user != (RTCRayQueryContext *)0x0) &&
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) != RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      occludedCoherent(valid_i,This,ray,context);
      return;
    }
    auVar16 = vpcmpeqd_avx(in_ZMM2._0_16_,in_ZMM2._0_16_);
    auVar28 = vpcmpeqd_avx(auVar16,(undefined1  [16])valid_i->field_0);
    auVar5 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,5);
    auVar17 = auVar28 & auVar5;
    if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar17[0xf] < '\0')
    {
      auVar5 = vandps_avx(auVar5,auVar28);
      local_1728 = *(undefined1 (*) [16])ray;
      auVar42 = ZEXT1664(local_1728);
      local_1738 = *(undefined1 (*) [16])(ray + 0x10);
      auVar43 = ZEXT1664(local_1738);
      local_1748 = *(undefined1 (*) [16])(ray + 0x20);
      auVar44 = ZEXT1664(local_1748);
      auVar28 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x40);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      auVar45 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      local_1758.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar28,auVar5);
      auVar46 = ZEXT1664((undefined1  [16])local_1758);
      local_17e8._4_4_ = auVar5._4_4_ ^ auVar16._4_4_;
      local_17e8._0_4_ = auVar5._0_4_ ^ auVar16._0_4_;
      local_17e8._8_4_ = auVar5._8_4_ ^ auVar16._8_4_;
      local_17e8._12_4_ = auVar5._12_4_ ^ auVar16._12_4_;
      stack_node[0].ptr = 0xfffffffffffffff8;
      stack_node[1].ptr = sVar13;
      stack_near[1].field_0 = local_1758;
      if (sVar13 != 0xfffffffffffffff8) {
        auVar30._8_4_ = 0x7fffffff;
        auVar30._0_8_ = 0x7fffffff7fffffff;
        auVar30._12_4_ = 0x7fffffff;
        auVar16 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar30);
        auVar39._8_4_ = 0x219392ef;
        auVar39._0_8_ = 0x219392ef219392ef;
        auVar39._12_4_ = 0x219392ef;
        auVar16 = vcmpps_avx(auVar16,auVar39,1);
        auVar28 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar39,auVar16);
        auVar16 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar30);
        auVar16 = vcmpps_avx(auVar16,auVar39,1);
        auVar17 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar39,auVar16);
        auVar16 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar30);
        auVar16 = vcmpps_avx(auVar16,auVar39,1);
        auVar16 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar39,auVar16);
        auVar30 = vrcpps_avx(auVar28);
        auVar32 = ZEXT1664(auVar30);
        fVar51 = auVar30._0_4_;
        auVar35._0_4_ = auVar28._0_4_ * fVar51;
        fVar52 = auVar30._4_4_;
        auVar35._4_4_ = auVar28._4_4_ * fVar52;
        fVar53 = auVar30._8_4_;
        auVar35._8_4_ = auVar28._8_4_ * fVar53;
        fVar54 = auVar30._12_4_;
        auVar35._12_4_ = auVar28._12_4_ * fVar54;
        auVar37._8_4_ = 0x3f800000;
        auVar37._0_8_ = 0x3f8000003f800000;
        auVar37._12_4_ = 0x3f800000;
        auVar30 = vsubps_avx(auVar37,auVar35);
        auVar28 = vrcpps_avx(auVar17);
        fVar47 = auVar28._0_4_;
        auVar33._0_4_ = auVar17._0_4_ * fVar47;
        fVar48 = auVar28._4_4_;
        auVar33._4_4_ = auVar17._4_4_ * fVar48;
        fVar49 = auVar28._8_4_;
        auVar33._8_4_ = auVar17._8_4_ * fVar49;
        fVar50 = auVar28._12_4_;
        auVar33._12_4_ = auVar17._12_4_ * fVar50;
        auVar17 = vsubps_avx(auVar37,auVar33);
        auVar28 = vrcpps_avx(auVar16);
        local_16f8 = auVar28._0_4_;
        auVar27._0_4_ = auVar16._0_4_ * local_16f8;
        fStack_16f4 = auVar28._4_4_;
        auVar27._4_4_ = auVar16._4_4_ * fStack_16f4;
        fStack_16f0 = auVar28._8_4_;
        auVar27._8_4_ = auVar16._8_4_ * fStack_16f0;
        fStack_16ec = auVar28._12_4_;
        auVar27._12_4_ = auVar16._12_4_ * fStack_16ec;
        auVar16 = vsubps_avx(auVar37,auVar27);
        fVar47 = fVar47 + fVar47 * auVar17._0_4_;
        fVar48 = fVar48 + fVar48 * auVar17._4_4_;
        fVar49 = fVar49 + fVar49 * auVar17._8_4_;
        fVar50 = fVar50 + fVar50 * auVar17._12_4_;
        fVar51 = fVar51 + fVar51 * auVar30._0_4_;
        fVar52 = fVar52 + fVar52 * auVar30._4_4_;
        fVar53 = fVar53 + fVar53 * auVar30._8_4_;
        fVar54 = fVar54 + fVar54 * auVar30._12_4_;
        local_16f8 = local_16f8 + local_16f8 * auVar16._0_4_;
        fStack_16f4 = fStack_16f4 + fStack_16f4 * auVar16._4_4_;
        fStack_16f0 = fStack_16f0 + fStack_16f0 * auVar16._8_4_;
        fStack_16ec = fStack_16ec + fStack_16ec * auVar16._12_4_;
        pNVar9 = stack_node + 1;
        local_1718 = mm_lookupmask_ps._0_8_;
        uStack_1710 = mm_lookupmask_ps._8_8_;
        auVar16 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
        auVar28._8_4_ = 0xff800000;
        auVar28._0_8_ = 0xff800000ff800000;
        auVar28._12_4_ = 0xff800000;
        bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                       vblendvps_avx(auVar28,auVar16,auVar5);
        paVar12 = &stack_near[2].field_0;
        local_1778 = fVar51;
        fStack_1774 = fVar52;
        fStack_1770 = fVar53;
        fStack_176c = fVar54;
        local_1768 = fVar47;
        fStack_1764 = fVar48;
        fStack_1760 = fVar49;
        fStack_175c = fVar50;
LAB_00306012:
        do {
          paVar1 = paVar12 + -1;
          auVar26 = ZEXT1664((undefined1  [16])*paVar1);
          paVar12 = paVar12 + -1;
          auVar16 = vcmpps_avx((undefined1  [16])*paVar1,(undefined1  [16])bi_8.field_0,1);
          if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar16[0xf] < '\0') {
LAB_0030602f:
            if ((sVar13 & 8) == 0) goto code_r0x00306039;
            if (sVar13 == 0xfffffffffffffff8) break;
            auVar16 = vcmpps_avx((undefined1  [16])bi_8.field_0,auVar26._0_16_,6);
            if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar16[0xf] < '\0') {
              uVar7 = (ulong)((uint)sVar13 & 0xf);
              auVar16 = vpcmpeqd_avx(auVar32._0_16_,auVar32._0_16_);
              auVar24 = local_17e8;
              if (uVar7 != 8) {
                auVar28 = local_17e8 ^ auVar16;
                uVar14 = 1;
                do {
                  local_17c0.geomID = *(uint *)(((sVar13 & 0xfffffffffffffff0) - 8) + uVar14 * 8);
                  local_1790 = (context->scene->geometries).items[local_17c0.geomID].ptr;
                  uVar3 = local_1790->mask;
                  auVar23._4_4_ = uVar3;
                  auVar23._0_4_ = uVar3;
                  auVar23._8_4_ = uVar3;
                  auVar23._12_4_ = uVar3;
                  auVar16 = vandps_avx(auVar23,*(undefined1 (*) [16])(ray + 0x90));
                  auVar16 = vpcmpeqd_avx(auVar16,_DAT_01f7aa10);
                  auVar17 = auVar28 & ~auVar16;
                  auVar6._8_8_ = uStack_1710;
                  auVar6._0_8_ = local_1718;
                  local_1708 = auVar28;
                  if ((((auVar17 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar17 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar17 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar17[0xf] < '\0') {
                    mask.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                   vandnps_avx(auVar16,auVar28);
                    local_17c0.primID = *(uint *)(((sVar13 & 0xfffffffffffffff0) - 4) + uVar14 * 8);
                    local_17c0.valid = (int *)&mask;
                    local_17c0.geometryUserPtr = local_1790->userPtr;
                    local_17c0.context = context->user;
                    local_17c0.N = 4;
                    local_1788 = 0;
                    local_1780 = context->args;
                    p_Var8 = local_1780->intersect;
                    if (p_Var8 == (RTCIntersectFunctionN)0x0) {
                      p_Var8 = (RTCIntersectFunctionN)
                               local_1790[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i;
                    }
                    local_17c0.rayhit = (RTCRayHitN *)ray;
                    (*p_Var8)(&local_17c0);
                    auVar6 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),_DAT_01f7aa10,1);
                    auVar42 = ZEXT1664(local_1728);
                    auVar43 = ZEXT1664(local_1738);
                    auVar44 = ZEXT1664(local_1748);
                    auVar45 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000))
                                      );
                    auVar46 = ZEXT1664((undefined1  [16])local_1758);
                    fVar47 = local_1768;
                    fVar48 = fStack_1764;
                    fVar49 = fStack_1760;
                    fVar50 = fStack_175c;
                    fVar51 = local_1778;
                    fVar52 = fStack_1774;
                    fVar53 = fStack_1770;
                    fVar54 = fStack_176c;
                  }
                  auVar28 = vandnps_avx(auVar6,local_1708);
                  auVar16 = local_1708 & ~auVar6;
                } while (((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar16[0xf] < '\0') &&
                        (bVar15 = uVar14 < uVar7 - 8, uVar14 = uVar14 + 1, local_1708 = auVar28,
                        bVar15));
                auVar16 = vpcmpeqd_avx(local_1708,local_1708);
                auVar24._0_4_ = auVar28._0_4_ ^ auVar16._0_4_;
                auVar24._4_4_ = auVar28._4_4_ ^ auVar16._4_4_;
                auVar24._8_4_ = auVar28._8_4_ ^ auVar16._8_4_;
                auVar24._12_4_ = auVar28._12_4_ ^ auVar16._12_4_;
              }
              local_17e8 = vpor_avx(local_17e8,auVar24);
              auVar16 = auVar16 & ~local_17e8;
              if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar16 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar16 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar16[0xf] < '\0') {
                auVar25._8_4_ = 0xff800000;
                auVar25._0_8_ = 0xff800000ff800000;
                auVar25._12_4_ = 0xff800000;
                bi_8.field_0 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                               vblendvps_avx((undefined1  [16])bi_8.field_0,auVar25,local_17e8);
                auVar32 = ZEXT1664((undefined1  [16])bi_8.field_0);
                goto LAB_0030633c;
              }
              break;
            }
          }
LAB_0030633c:
          sVar13 = pNVar9[-1].ptr;
          pNVar9 = pNVar9 + -1;
        } while (sVar13 != 0xfffffffffffffff8);
      }
LAB_0030635a:
      auVar5 = vpand_avx(auVar5,local_17e8);
      auVar29._8_4_ = 0xff800000;
      auVar29._0_8_ = 0xff800000ff800000;
      auVar29._12_4_ = 0xff800000;
      auVar5 = vmaskmovps_avx(auVar5,auVar29);
      *(undefined1 (*) [16])(ray + 0x80) = auVar5;
    }
  }
  return;
code_r0x00306039:
  lVar11 = 0;
  sVar10 = 8;
  aVar22 = auVar45._0_16_;
  do {
    sVar4 = *(size_t *)((sVar13 & 0xfffffffffffffff0) + lVar11 * 8);
    if (sVar4 == 8) {
      auVar26 = ZEXT1664((undefined1  [16])aVar22);
      break;
    }
    uVar2 = *(undefined4 *)(sVar13 + 0x20 + lVar11 * 4);
    auVar16._4_4_ = uVar2;
    auVar16._0_4_ = uVar2;
    auVar16._8_4_ = uVar2;
    auVar16._12_4_ = uVar2;
    auVar16 = vsubps_avx(auVar16,auVar42._0_16_);
    auVar31._0_4_ = fVar51 * auVar16._0_4_;
    auVar31._4_4_ = fVar52 * auVar16._4_4_;
    auVar31._8_4_ = fVar53 * auVar16._8_4_;
    auVar31._12_4_ = fVar54 * auVar16._12_4_;
    uVar2 = *(undefined4 *)(sVar13 + 0x40 + lVar11 * 4);
    auVar17._4_4_ = uVar2;
    auVar17._0_4_ = uVar2;
    auVar17._8_4_ = uVar2;
    auVar17._12_4_ = uVar2;
    auVar16 = vsubps_avx(auVar17,auVar43._0_16_);
    auVar34._0_4_ = fVar47 * auVar16._0_4_;
    auVar34._4_4_ = fVar48 * auVar16._4_4_;
    auVar34._8_4_ = fVar49 * auVar16._8_4_;
    auVar34._12_4_ = fVar50 * auVar16._12_4_;
    uVar2 = *(undefined4 *)(sVar13 + 0x60 + lVar11 * 4);
    auVar18._4_4_ = uVar2;
    auVar18._0_4_ = uVar2;
    auVar18._8_4_ = uVar2;
    auVar18._12_4_ = uVar2;
    auVar16 = vsubps_avx(auVar18,auVar44._0_16_);
    auVar36._0_4_ = local_16f8 * auVar16._0_4_;
    auVar36._4_4_ = fStack_16f4 * auVar16._4_4_;
    auVar36._8_4_ = fStack_16f0 * auVar16._8_4_;
    auVar36._12_4_ = fStack_16ec * auVar16._12_4_;
    uVar2 = *(undefined4 *)(sVar13 + 0x30 + lVar11 * 4);
    auVar19._4_4_ = uVar2;
    auVar19._0_4_ = uVar2;
    auVar19._8_4_ = uVar2;
    auVar19._12_4_ = uVar2;
    auVar16 = vsubps_avx(auVar19,auVar42._0_16_);
    auVar38._0_4_ = fVar51 * auVar16._0_4_;
    auVar38._4_4_ = fVar52 * auVar16._4_4_;
    auVar38._8_4_ = fVar53 * auVar16._8_4_;
    auVar38._12_4_ = fVar54 * auVar16._12_4_;
    uVar2 = *(undefined4 *)(sVar13 + 0x50 + lVar11 * 4);
    auVar20._4_4_ = uVar2;
    auVar20._0_4_ = uVar2;
    auVar20._8_4_ = uVar2;
    auVar20._12_4_ = uVar2;
    auVar16 = vsubps_avx(auVar20,auVar43._0_16_);
    auVar40._0_4_ = fVar47 * auVar16._0_4_;
    auVar40._4_4_ = fVar48 * auVar16._4_4_;
    auVar40._8_4_ = fVar49 * auVar16._8_4_;
    auVar40._12_4_ = fVar50 * auVar16._12_4_;
    uVar2 = *(undefined4 *)(sVar13 + 0x70 + lVar11 * 4);
    auVar21._4_4_ = uVar2;
    auVar21._0_4_ = uVar2;
    auVar21._8_4_ = uVar2;
    auVar21._12_4_ = uVar2;
    auVar16 = vsubps_avx(auVar21,auVar44._0_16_);
    auVar41._0_4_ = local_16f8 * auVar16._0_4_;
    auVar41._4_4_ = fStack_16f4 * auVar16._4_4_;
    auVar41._8_4_ = fStack_16f0 * auVar16._8_4_;
    auVar41._12_4_ = fStack_16ec * auVar16._12_4_;
    auVar16 = vpminsd_avx(auVar31,auVar38);
    auVar28 = vpminsd_avx(auVar34,auVar40);
    auVar16 = vpmaxsd_avx(auVar16,auVar28);
    auVar28 = vpminsd_avx(auVar36,auVar41);
    auVar28 = vpmaxsd_avx(auVar16,auVar28);
    auVar16 = vpmaxsd_avx(auVar31,auVar38);
    auVar17 = vpmaxsd_avx(auVar34,auVar40);
    auVar30 = vpminsd_avx(auVar16,auVar17);
    auVar16 = vpmaxsd_avx(auVar36,auVar41);
    auVar17 = vpmaxsd_avx(auVar28,auVar46._0_16_);
    auVar16 = vpminsd_avx(auVar16,(undefined1  [16])bi_8.field_0);
    auVar16 = vpminsd_avx(auVar30,auVar16);
    auVar16 = vcmpps_avx(auVar17,auVar16,2);
    auVar32 = ZEXT1664(auVar16);
    if ((((auVar16 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar16 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar16 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar16[0xf]) {
      auVar26 = ZEXT1664((undefined1  [16])aVar22);
      sVar4 = sVar10;
    }
    else {
      auVar16 = vblendvps_avx((undefined1  [16])auVar45._0_16_,auVar28,auVar16);
      auVar26 = ZEXT1664(auVar16);
      if (sVar10 != 8) {
        pNVar9->ptr = sVar10;
        pNVar9 = pNVar9 + 1;
        *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar12->v = aVar22;
        paVar12 = paVar12 + 1;
      }
    }
    sVar10 = sVar4;
    lVar11 = lVar11 + 1;
    aVar22 = auVar26._0_16_;
  } while (lVar11 != 4);
  sVar13 = sVar10;
  if (sVar10 == 8) goto code_r0x0030615c;
  goto LAB_0030602f;
code_r0x0030615c:
  sVar13 = pNVar9[-1].ptr;
  pNVar9 = pNVar9 + -1;
  if (sVar13 == 0xfffffffffffffff8) goto LAB_0030635a;
  goto LAB_00306012;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }